

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

BOOL __thiscall
Js::JavascriptArray::SetArrayLikeObjects
          (JavascriptArray *this,RecyclableObject *pDestObj,BigIndex idxDest,Var aItem)

{
  bool bVar1;
  uint32 value;
  PropertyId propId;
  BOOL BVar2;
  ScriptContext *scriptContext_00;
  uint64 value_00;
  undefined1 local_68 [8];
  PropertyDescriptor propertyDescriptor;
  PropertyRecord *propertyRecord;
  ScriptContext *scriptContext;
  Var aItem_local;
  RecyclableObject *pDestObj_local;
  BigIndex idxDest_local;
  
  idxDest_local._0_8_ = idxDest._0_8_;
  pDestObj_local._0_4_ = SUB84(pDestObj,0);
  scriptContext_00 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
  bVar1 = BigIndex::IsSmallIndex((BigIndex *)&pDestObj_local);
  if (bVar1) {
    value = BigIndex::GetSmallIndex((BigIndex *)&pDestObj_local);
    Js::JavascriptOperators::GetPropertyIdForInt
              (value,scriptContext_00,(PropertyRecord **)&propertyDescriptor.Configurable);
  }
  else {
    value_00 = BigIndex::GetBigIndex((BigIndex *)&pDestObj_local);
    Js::JavascriptOperators::GetPropertyIdForInt
              (value_00,scriptContext_00,(PropertyRecord **)&propertyDescriptor.Configurable);
  }
  PropertyDescriptor::PropertyDescriptor((PropertyDescriptor *)local_68);
  PropertyDescriptor::SetConfigurable((PropertyDescriptor *)local_68,true);
  PropertyDescriptor::SetEnumerable((PropertyDescriptor *)local_68,true);
  PropertyDescriptor::SetWritable((PropertyDescriptor *)local_68,true);
  PropertyDescriptor::SetValue((PropertyDescriptor *)local_68,(Var)idxDest.bigIndex);
  propId = PropertyRecord::GetPropertyId((PropertyRecord *)propertyDescriptor._40_8_);
  BVar2 = JavascriptObject::DefineOwnPropertyHelper
                    ((RecyclableObject *)this,propId,(PropertyDescriptor *)local_68,scriptContext_00
                     ,false);
  return BVar2;
}

Assistant:

BOOL JavascriptArray::SetArrayLikeObjects(RecyclableObject* pDestObj, BigIndex idxDest, Var aItem)
    {
        ScriptContext* scriptContext = pDestObj->GetScriptContext();

        PropertyRecord const * propertyRecord;
        if (idxDest.IsSmallIndex())
        {
            JavascriptOperators::GetPropertyIdForInt(idxDest.GetSmallIndex(), scriptContext, &propertyRecord);
        }
        else
        {
            JavascriptOperators::GetPropertyIdForInt(idxDest.GetBigIndex(), scriptContext, &propertyRecord);
        }

        PropertyDescriptor propertyDescriptor;
        propertyDescriptor.SetConfigurable(true);
        propertyDescriptor.SetEnumerable(true);
        propertyDescriptor.SetWritable(true);
        propertyDescriptor.SetValue(aItem);
        return JavascriptObject::DefineOwnPropertyHelper(pDestObj, propertyRecord->GetPropertyId(), propertyDescriptor, scriptContext, false);
    }